

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

void SetSegmentProbas(VP8Encoder *enc)

{
  VP8Encoder *pVVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  VP8EncProba *pVVar11;
  VP8Encoder *in_RDI;
  uint8_t *probas;
  VP8MBInfo *mb;
  int n;
  int p [4];
  bool local_31;
  int local_1c;
  int local_18 [4];
  VP8Encoder *local_8;
  
  local_8 = in_RDI;
  memset(local_18,0,0x10);
  for (local_1c = 0; pVVar1 = local_8, local_1c < local_8->mb_w * local_8->mb_h;
      local_1c = local_1c + 1) {
    bVar2 = *(byte *)(local_8->mb_info + local_1c) >> 5 & 3;
    local_18[bVar2] = local_18[bVar2] + 1;
  }
  if (local_8->pic->stats != (WebPAuxStats *)0x0) {
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      local_8->pic->stats->segment_size[local_1c] = local_18[local_1c];
    }
  }
  if ((local_8->segment_hdr).num_segments < 2) {
    (local_8->segment_hdr).update_map = 0;
    (local_8->segment_hdr).size = 0;
  }
  else {
    pVVar11 = &local_8->proba;
    iVar3 = GetProba(local_18[0] + local_18[1],local_18[2] + local_18[3]);
    pVVar11->segments[0] = (uint8_t)iVar3;
    iVar3 = GetProba(local_18[0],local_18[1]);
    (pVVar1->proba).segments[1] = (uint8_t)iVar3;
    iVar3 = GetProba(local_18[2],local_18[3]);
    (pVVar1->proba).segments[2] = (uint8_t)iVar3;
    local_31 = true;
    if ((pVVar11->segments[0] == 0xff) && (local_31 = true, (pVVar1->proba).segments[1] == 0xff)) {
      local_31 = (pVVar1->proba).segments[2] != 0xff;
    }
    (local_8->segment_hdr).update_map = (uint)local_31;
    if ((local_8->segment_hdr).update_map == 0) {
      ResetSegments(local_8);
    }
    iVar3 = VP8BitCost(0,pVVar11->segments[0]);
    iVar4 = VP8BitCost(0,(pVVar1->proba).segments[1]);
    iVar5 = VP8BitCost(0,pVVar11->segments[0]);
    iVar6 = VP8BitCost(1,(pVVar1->proba).segments[1]);
    iVar7 = VP8BitCost(1,pVVar11->segments[0]);
    iVar8 = VP8BitCost(0,(pVVar1->proba).segments[2]);
    iVar9 = VP8BitCost(1,pVVar11->segments[0]);
    iVar10 = VP8BitCost(1,(pVVar1->proba).segments[2]);
    (local_8->segment_hdr).size =
         local_18[0] * (iVar3 + iVar4) + local_18[1] * (iVar5 + iVar6) +
         local_18[2] * (iVar7 + iVar8) + local_18[3] * (iVar9 + iVar10);
  }
  return;
}

Assistant:

static void SetSegmentProbas(VP8Encoder* const enc) {
  int p[NUM_MB_SEGMENTS] = { 0 };
  int n;

  for (n = 0; n < enc->mb_w * enc->mb_h; ++n) {
    const VP8MBInfo* const mb = &enc->mb_info[n];
    ++p[mb->segment];
  }
#if !defined(WEBP_DISABLE_STATS)
  if (enc->pic->stats != NULL) {
    for (n = 0; n < NUM_MB_SEGMENTS; ++n) {
      enc->pic->stats->segment_size[n] = p[n];
    }
  }
#endif
  if (enc->segment_hdr.num_segments > 1) {
    uint8_t* const probas = enc->proba.segments;
    probas[0] = GetProba(p[0] + p[1], p[2] + p[3]);
    probas[1] = GetProba(p[0], p[1]);
    probas[2] = GetProba(p[2], p[3]);

    enc->segment_hdr.update_map =
        (probas[0] != 255) || (probas[1] != 255) || (probas[2] != 255);
    if (!enc->segment_hdr.update_map) ResetSegments(enc);
    enc->segment_hdr.size =
        p[0] * (VP8BitCost(0, probas[0]) + VP8BitCost(0, probas[1])) +
        p[1] * (VP8BitCost(0, probas[0]) + VP8BitCost(1, probas[1])) +
        p[2] * (VP8BitCost(1, probas[0]) + VP8BitCost(0, probas[2])) +
        p[3] * (VP8BitCost(1, probas[0]) + VP8BitCost(1, probas[2]));
  } else {
    enc->segment_hdr.update_map = 0;
    enc->segment_hdr.size = 0;
  }
}